

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

depth_first_traverser * __thiscall
clipp::group::depth_first_traverser::back_to_ancestor(depth_first_traverser *this,group *g)

{
  pointer pcVar1;
  child_t<clipp::parameter,_clipp::group> *pcVar2;
  pointer pcVar3;
  
  if (g != (group *)0x0) {
    pcVar1 = (this->stack_).
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (this->stack_).
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while ((pcVar3 != pcVar1 &&
           ((pcVar2 = pcVar3[-1].cur._M_current,
            pcVar2 != (child_t<clipp::parameter,_clipp::group> *)g || (pcVar2->type_ != group))))) {
      pcVar3 = pcVar3 + -1;
      (this->stack_).
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish = pcVar3;
    }
  }
  return this;
}

Assistant:

depth_first_traverser&
        back_to_ancestor(const group* g) {
            if(!g) return *this;
            while(!stack_.empty()) {
                const auto& top = stack_.back().cur;
                if(top->is_group() && &(top->as_group()) == g) return *this;
                stack_.pop_back();
            }
            return *this;
        }